

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_19bb9b::SymlinkTool::configureAttribute
          (SymlinkTool *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  char *LHS;
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Twine local_78;
  Child local_58;
  NodeKind local_48;
  char cStack_47;
  undefined6 uStack_46;
  Child local_40;
  NodeKind local_30;
  char cStack_2f;
  undefined6 uStack_2e;
  StringRef local_28;
  
  local_28.Length = name.Length;
  local_28.Data = name.Data;
  piVar1 = (int *)value.Data;
  if ((local_28.Length == 0x1d) &&
     (auVar3[0] = -(local_28.Data[0xd] == 'n'), auVar3[1] = -(local_28.Data[0xe] == 'e'),
     auVar3[2] = -(local_28.Data[0xf] == 'r'), auVar3[3] = -(local_28.Data[0x10] == 's'),
     auVar3[4] = -(local_28.Data[0x11] == 'h'), auVar3[5] = -(local_28.Data[0x12] == 'i'),
     auVar3[6] = -(local_28.Data[0x13] == 'p'), auVar3[7] = -(local_28.Data[0x14] == '-'),
     auVar3[8] = -(local_28.Data[0x15] == 'a'), auVar3[9] = -(local_28.Data[0x16] == 'n'),
     auVar3[10] = -(local_28.Data[0x17] == 'a'), auVar3[0xb] = -(local_28.Data[0x18] == 'l'),
     auVar3[0xc] = -(local_28.Data[0x19] == 'y'), auVar3[0xd] = -(local_28.Data[0x1a] == 's'),
     auVar3[0xe] = -(local_28.Data[0x1b] == 'i'), auVar3[0xf] = -(local_28.Data[0x1c] == 's'),
     auVar2[0] = -(*local_28.Data == 'r'), auVar2[1] = -(local_28.Data[1] == 'e'),
     auVar2[2] = -(local_28.Data[2] == 'p'), auVar2[3] = -(local_28.Data[3] == 'a'),
     auVar2[4] = -(local_28.Data[4] == 'i'), auVar2[5] = -(local_28.Data[5] == 'r'),
     auVar2[6] = -(local_28.Data[6] == '-'), auVar2[7] = -(local_28.Data[7] == 'v'),
     auVar2[8] = -(local_28.Data[8] == 'i'), auVar2[9] = -(local_28.Data[9] == 'a'),
     auVar2[10] = -(local_28.Data[10] == '-'), auVar2[0xb] = -(local_28.Data[0xb] == 'o'),
     auVar2[0xc] = -(local_28.Data[0xc] == 'w'), auVar2[0xd] = -(local_28.Data[0xd] == 'n'),
     auVar2[0xe] = -(local_28.Data[0xe] == 'e'), auVar2[0xf] = -(local_28.Data[0xf] == 'r'),
     auVar2 = auVar2 & auVar3,
     (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) == 0xffff)) {
    if (value.Length == 5) {
      if ((char)piVar1[1] == 'e' && *piVar1 == 0x736c6166) {
        this->repairViaOwnershipAnalysis = false;
        return true;
      }
    }
    else if ((value.Length == 4) && (*piVar1 == 0x65757274)) {
      this->repairViaOwnershipAnalysis = true;
      return true;
    }
    LHS = "invalid value for attribute: \'";
  }
  else {
    LHS = "unexpected attribute: \'";
  }
  llvm::Twine::Twine((Twine *)&local_40,LHS,&local_28);
  llvm::Twine::Twine((Twine *)&local_58,"\'");
  if ((local_30 == NullKind) || (local_48 == NullKind)) {
    local_78._16_2_ = 0x100;
  }
  else if (local_30 == EmptyKind) {
    local_78.RHSKind = cStack_47;
    local_78.LHSKind = local_48;
    local_78._18_6_ = uStack_46;
  }
  else if (local_48 == EmptyKind) {
    local_78.RHSKind = cStack_2f;
    local_78.LHSKind = local_30;
    local_78._18_6_ = uStack_2e;
  }
  else {
    if (cStack_2f != '\x01') {
      local_30 = TwineKind;
      local_40.twine = (Twine *)&local_40;
    }
    if (cStack_47 != '\x01') {
      local_48 = TwineKind;
      local_58.twine = (Twine *)&local_58;
    }
    llvm::Twine::Twine(&local_78,local_40,local_30,local_58,local_48);
  }
  llbuild::buildsystem::ConfigureContext::error(ctx,&local_78);
  return false;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "repair-via-ownership-analysis") {
      if (value == "true") {
        repairViaOwnershipAnalysis = true;
        return true;
      } else if(value == "false") {
        repairViaOwnershipAnalysis = false;
        return true;
      } else {
        ctx.error("invalid value for attribute: '" + name + "'");
        return false;
      }
    } else {
      ctx.error("unexpected attribute: '" + name + "'");
      return false;
    }
  }